

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_timestamp(void)

{
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int32_t *piVar6;
  int32_t *piVar7;
  bson_t *bcon;
  int32_t increment;
  int32_t timestamp;
  
  uVar4 = bson_bcon_magic();
  iVar2 = bcon_ensure_int32(100);
  iVar3 = bcon_ensure_int32(1000);
  uVar4 = bcon_new(0,"foo",uVar4,0x10,iVar2,iVar3,0);
  uVar5 = bson_bcone_magic();
  piVar6 = bcon_ensure_int32_ptr((int32_t *)((long)&bcon + 4));
  piVar7 = bcon_ensure_int32_ptr((int32_t *)&bcon);
  bVar1 = bcon_extract(uVar4,"foo",uVar5,0x10,piVar6,piVar7,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xfc,"test_timestamp",
            "BCON_EXTRACT (bcon, \"foo\", BCONE_TIMESTAMP (timestamp, increment))");
    abort();
  }
  if (bcon._4_4_ != 100) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xfe,"test_timestamp","timestamp == 100");
    abort();
  }
  if ((int)bcon != 1000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xff,"test_timestamp","increment == 1000");
    abort();
  }
  bson_destroy(uVar4);
  return;
}

Assistant:

static void
test_timestamp (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_timestamp (&expected, "foo", -1, 100, 1000);

   BCON_APPEND (&bcon, "foo", BCON_TIMESTAMP (100, 1000));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}